

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

bool cmDependsFortran::ModulesDiffer(string *modFile,string *stampFile,string *compilerId)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  bool bVar7;
  char seq [2];
  char seq_1 [1];
  ifstream finModFile;
  ifstream finStampFile;
  char local_434 [3];
  char local_431;
  long local_430 [4];
  byte abStack_410 [488];
  long local_228 [4];
  uint auStack_208 [122];
  
  iVar3 = std::__cxx11::string::compare((char *)compilerId);
  if (iVar3 == 0) {
    bVar7 = cmsys::SystemTools::FilesDiffer(modFile,stampFile);
    return bVar7;
  }
  std::ifstream::ifstream(local_430,(modFile->_M_dataplus)._M_p,_S_in);
  std::ifstream::ifstream(local_228,(stampFile->_M_dataplus)._M_p,_S_in);
  bVar7 = true;
  if (((abStack_410[*(long *)(local_430[0] + -0x18)] & 5) != 0) ||
     ((*(byte *)((long)auStack_208 + *(long *)(local_228[0] + -0x18)) & 5) != 0)) goto LAB_004e0c88;
  iVar3 = std::__cxx11::string::compare((char *)compilerId);
  if (iVar3 == 0) {
    plVar5 = (long *)std::istream::read((char *)local_430,(long)local_434);
    uVar1 = *(uint *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20);
    std::istream::seekg(local_430,0,0);
    if ((((uVar1 & 5) != 0) || (local_434[0] != '\x1f')) || (local_434[1] != -0x75)) {
      local_431 = '\n';
      bVar2 = cmFortranStreamContainsSequence((istream *)local_430,&local_431,1);
      if (!bVar2) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(compilerId->_M_dataplus)._M_p,
                            compilerId->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," fortran module ",0x10);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(modFile->_M_dataplus)._M_p,modFile->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," has unexpected format.",0x17);
        std::endl<char,std::char_traits<char>>(poVar6);
        goto LAB_004e0c88;
      }
      bVar2 = cmFortranStreamContainsSequence((istream *)local_228,&local_431,1);
      goto LAB_004e0dce;
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)compilerId);
    if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)compilerId), iVar3 == 0)) {
      local_434[0] = '\n';
      local_434[1] = '\0';
      std::istream::get();
      std::istream::get();
      bVar2 = cmFortranStreamContainsSequence((istream *)local_430,local_434,2);
      if (!bVar2) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(compilerId->_M_dataplus)._M_p,
                            compilerId->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," fortran module ",0x10);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(modFile->_M_dataplus)._M_p,modFile->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," has unexpected format.",0x17);
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        goto LAB_004e0c88;
      }
      bVar2 = cmFortranStreamContainsSequence((istream *)local_228,local_434,2);
LAB_004e0dce:
      if (bVar2 == false) goto LAB_004e0c88;
    }
  }
  while( true ) {
    iVar3 = std::istream::get();
    iVar4 = std::istream::get();
    if ((abStack_410[*(long *)(local_430[0] + -0x18)] & 5) != 0) break;
    if ((iVar3 != iVar4) ||
       ((*(uint *)((long)auStack_208 + *(long *)(local_228[0] + -0x18)) & 5) != 0))
    goto LAB_004e0c88;
  }
  bVar7 = (*(byte *)((long)auStack_208 + *(long *)(local_228[0] + -0x18)) & 5) == 0;
LAB_004e0c88:
  std::ifstream::~ifstream(local_228);
  std::ifstream::~ifstream(local_430);
  return bVar7;
}

Assistant:

bool cmDependsFortran::ModulesDiffer(const std::string& modFile,
                                     const std::string& stampFile,
                                     const std::string& compilerId)
{
  /*
  gnu >= 4.9:
    A mod file is an ascii file compressed with gzip.
    Compiling twice produces identical modules.

  gnu < 4.9:
    A mod file is an ascii file.
    <bar.mod>
    FORTRAN module created from /path/to/foo.f90 on Sun Dec 30 22:47:58 2007
    If you edit this, you'll get what you deserve.
    ...
    </bar.mod>
    As you can see the first line contains the date.

  intel:
    A mod file is a binary file.
    However, looking into both generated bar.mod files with a hex editor
    shows that they differ only before a sequence linefeed-zero (0x0A 0x00)
    which is located some bytes in front of the absolute path to the source
    file.

  sun:
    A mod file is a binary file.  Compiling twice produces identical modules.

  others:
    TODO ...
  */

  /* Compilers which do _not_ produce different mod content when the same
   * source is compiled twice
   *   -SunPro
   */
  if (compilerId == "SunPro") {
    return cmSystemTools::FilesDiffer(modFile, stampFile);
  }

#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream finModFile(modFile.c_str(), std::ios::in | std::ios::binary);
  cmsys::ifstream finStampFile(stampFile.c_str(),
                               std::ios::in | std::ios::binary);
#else
  cmsys::ifstream finModFile(modFile.c_str());
  cmsys::ifstream finStampFile(stampFile.c_str());
#endif
  if (!finModFile || !finStampFile) {
    // At least one of the files does not exist.  The modules differ.
    return true;
  }

  /* Compilers which _do_ produce different mod content when the same
   * source is compiled twice
   *   -GNU
   *   -Intel
   *
   * Eat the stream content until all recompile only related changes
   * are left behind.
   */
  if (compilerId == "GNU") {
    // GNU Fortran 4.9 and later compress .mod files with gzip
    // but also do not include a date so we can fall through to
    // compare them without skipping any prefix.
    unsigned char hdr[2];
    bool okay = !finModFile.read(reinterpret_cast<char*>(hdr), 2).fail();
    finModFile.seekg(0);
    if (!okay || hdr[0] != 0x1f || hdr[1] != 0x8b) {
      const char seq[1] = { '\n' };
      const int seqlen = 1;

      if (!cmFortranStreamContainsSequence(finModFile, seq, seqlen)) {
        // The module is of unexpected format.  Assume it is different.
        std::cerr << compilerId << " fortran module " << modFile
                  << " has unexpected format." << std::endl;
        return true;
      }

      if (!cmFortranStreamContainsSequence(finStampFile, seq, seqlen)) {
        // The stamp must differ if the sequence is not contained.
        return true;
      }
    }
  } else if (compilerId == "Intel" || compilerId == "IntelLLVM") {
    const char seq[2] = { '\n', '\0' };
    const int seqlen = 2;

    // Skip the leading byte which appears to be a version number.
    // We do not need to check for an error because the sequence search
    // below will fail in that case.
    finModFile.get();
    finStampFile.get();

    if (!cmFortranStreamContainsSequence(finModFile, seq, seqlen)) {
      // The module is of unexpected format.  Assume it is different.
      std::cerr << compilerId << " fortran module " << modFile
                << " has unexpected format." << std::endl;
      return true;
    }

    if (!cmFortranStreamContainsSequence(finStampFile, seq, seqlen)) {
      // The stamp must differ if the sequence is not contained.
      return true;
    }
  }

  // Compare the remaining content.  If no compiler id matched above,
  // including the case none was given, this will compare the whole
  // content.
  return cmFortranStreamsDiffer(finModFile, finStampFile);
}